

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O2

int get_item_for_cursor(coda_tree_node *node,int depth,coda_cursor *cursor,void **item)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar6;
  ulong uVar7;
  void *pvVar5;
  
  if (node == (coda_tree_node *)0x0) {
LAB_0015b4c5:
    pvVar5 = (void *)0x0;
  }
  else {
    if (depth < cursor->n + -1) {
      if (0 < node->num_indexed_children) {
        lVar1 = cursor->stack[depth + 1].index;
        uVar2 = (ulong)(node->num_indexed_children - 1);
        uVar7 = 0;
        while (uVar6 = uVar2, uVar6 != uVar7) {
          uVar4 = (long)(uVar7 + uVar6) / 2;
          uVar2 = uVar4;
          if (node->index[uVar4] < lVar1) {
            uVar2 = uVar6;
            uVar7 = uVar4 + 1;
          }
        }
        if (lVar1 == node->index[uVar6]) {
          uVar3 = get_item_for_cursor(node->indexed_child[uVar6],depth + 1,cursor,item);
          pvVar5 = (void *)(ulong)uVar3;
          if (item != (void **)0x0) goto LAB_0015b4ca;
        }
      }
      if (node->all_children != (coda_tree_node *)0x0) {
        uVar3 = get_item_for_cursor(node->all_children,depth + 1,cursor,item);
        pvVar5 = (void *)(ulong)uVar3;
        if (item != (void **)0x0) goto LAB_0015b4ca;
      }
      goto LAB_0015b4c5;
    }
    if ((long)node->num_items < 1) goto LAB_0015b4c5;
    pvVar5 = node->item[(long)node->num_items + -1];
  }
  *item = pvVar5;
LAB_0015b4ca:
  return (int)pvVar5;
}

Assistant:

static int get_item_for_cursor(coda_tree_node *node, int depth, coda_cursor *cursor, void **item)
{
    if (node == NULL)
    {
        *item = NULL;
        return 0;
    }

    if (depth < cursor->n - 1)
    {
        /* specific indexed array elements take precedence over an 'all array elements' reference */
        if (node->num_indexed_children > 0)
        {
            long bottom = 0;
            long top = node->num_indexed_children - 1;
            long index = cursor->stack[depth + 1].index;

            while (top != bottom)
            {
                long middle = (bottom + top) / 2;

                if (index <= node->index[middle])
                {
                    top = middle;
                }
                if (index > node->index[middle])
                {
                    bottom = middle + 1;
                }
            }
            if (index == node->index[top])
            {
                if (get_item_for_cursor(node->indexed_child[top], depth + 1, cursor, item) != 0)
                {
                    return -1;
                }
                if (item != NULL)
                {
                    return 0;
                }
            }
        }
        if (node->all_children != NULL)
        {
            if (get_item_for_cursor(node->all_children, depth + 1, cursor, item) != 0)
            {
                return -1;
            }
            if (item != NULL)
            {
                return 0;
            }
        }
    }
    else if (node->num_items > 0)
    {
        /* return the last item in the list */
        *item = node->item[node->num_items - 1];
        return 0;
    }

    /* nothing found */
    *item = NULL;
    return 0;
}